

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

char * match_capture(MatchState *ms,char *s,int l)

{
  ulong __n;
  int iVar1;
  size_t len;
  int l_local;
  char *s_local;
  MatchState *ms_local;
  
  iVar1 = check_capture(ms,l);
  __n = ms->capture[iVar1].len;
  if ((__n <= (ulong)((long)ms->src_end - (long)s)) &&
     (iVar1 = memcmp(ms->capture[iVar1].init,s,__n), iVar1 == 0)) {
    return s + __n;
  }
  return (char *)0x0;
}

Assistant:

static const char *match_capture(MatchState *ms, const char *s, int l)
{
  size_t len;
  l = check_capture(ms, l);
  len = (size_t)ms->capture[l].len;
  if ((size_t)(ms->src_end-s) >= len &&
      memcmp(ms->capture[l].init, s, len) == 0)
    return s+len;
  else
    return NULL;
}